

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_get_scroll(nk_context *ctx,nk_uint *offset_x,nk_uint *offset_y)

{
  nk_window *pnVar1;
  nk_window *win;
  nk_uint *offset_y_local;
  nk_uint *offset_x_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4097,"void nk_window_get_scroll(struct nk_context *, nk_uint *, nk_uint *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4098,"void nk_window_get_scroll(struct nk_context *, nk_uint *, nk_uint *)");
  }
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    pnVar1 = ctx->current;
    if (offset_x != (nk_uint *)0x0) {
      *offset_x = (pnVar1->scrollbar).x;
    }
    if (offset_y != (nk_uint *)0x0) {
      *offset_y = (pnVar1->scrollbar).y;
    }
  }
  return;
}

Assistant:

NK_API void
nk_window_get_scroll(struct nk_context *ctx, nk_uint *offset_x, nk_uint *offset_y)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return ;
    win = ctx->current;
    if (offset_x)
      *offset_x = win->scrollbar.x;
    if (offset_y)
      *offset_y = win->scrollbar.y;
}